

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

double __thiscall r_exec::View::update_act(View *this,double low,double high)

{
  float fVar1;
  float fVar2;
  double dVar3;
  Atom local_2c [4];
  double local_28;
  double local_20;
  
  local_28 = high;
  local_20 = low;
  if ((this->act_changes != 0) && ((this->acc_act != 0.0 || (NAN(this->acc_act))))) {
    fVar1 = (float)r_code::Atom::asFloat();
    fVar1 = fVar1 + this->acc_act / (float)this->act_changes;
    fVar2 = 0.0;
    if ((0.0 <= fVar1) && (fVar2 = fVar1, 1.0 < fVar1)) {
      fVar2 = 1.0;
    }
    r_code::Atom::Float(fVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x44,local_2c);
    r_code::Atom::~Atom(local_2c);
  }
  this->acc_act = 0.0;
  this->act_changes = 0;
  fVar2 = (float)r_code::Atom::asFloat();
  dVar3 = (double)fVar2;
  if (local_20 <= dVar3) {
    this->periods_at_low_act = 0;
    if (dVar3 <= local_28) {
      this->periods_at_high_act = 0;
    }
    else {
      this->periods_at_high_act = this->periods_at_high_act + 1;
    }
  }
  else {
    this->periods_at_low_act = this->periods_at_low_act + 1;
  }
  return dVar3;
}

Assistant:

double View::update_act(double low, double high)
{
    if (act_changes > 0 && acc_act != 0) {
        double new_act = get_act() + acc_act / act_changes;

        if (new_act < 0) {
            new_act = 0;
        } else if (new_act > 1) {
            new_act = 1;
        }

        code(VIEW_ACT) = r_code::Atom::Float(new_act);
    }

    acc_act = 0;
    act_changes = 0;
    double act = get_act();

    if (act < low) {
        ++periods_at_low_act;
    } else {
        periods_at_low_act = 0;

        if (act > high) {
            ++periods_at_high_act;
        } else {
            periods_at_high_act = 0;
        }
    }

    return act;
}